

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture2DProjGrad3Offset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture2D *pTVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar9;
  float fVar10;
  undefined1 auVar8 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  pTVar4 = c->textures[0].tex2D;
  fVar6 = (float)pTVar4->m_width;
  fVar11 = (float)pTVar4->m_height;
  fVar7 = fVar6 * c->in[1].m_data[0];
  fVar9 = fVar6 * c->in[2].m_data[0];
  fVar10 = fVar6 * c->in[1].m_data[2];
  fVar6 = fVar6 * c->in[1].m_data[3];
  fVar12 = fVar11 * c->in[1].m_data[1];
  fVar13 = fVar11 * c->in[2].m_data[1];
  fVar14 = fVar11 * c->in[1].m_data[3];
  fVar11 = fVar11 * c->in[2].m_data[0];
  auVar8._0_4_ = fVar7 * fVar7 + fVar12 * fVar12;
  auVar8._4_4_ = fVar9 * fVar9 + fVar13 * fVar13;
  auVar8._8_4_ = fVar10 * fVar10 + fVar14 * fVar14;
  auVar8._12_4_ = fVar6 * fVar6 + fVar11 * fVar11;
  auVar8 = sqrtps(auVar8,auVar8);
  uVar5 = -(uint)(auVar8._4_4_ <= auVar8._0_4_);
  fVar6 = logf((float)(~uVar5 & (uint)auVar8._4_4_ | (uint)auVar8._0_4_ & uVar5));
  pTVar4 = c->textures[0].tex2D;
  tcu::sampleLevelArray2DOffset
            ((ConstPixelBufferAccess *)&local_28,(int)(pTVar4->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar4->m_view).m_numLevels,fVar2 / fVar1,fVar3 / fVar1,
             fVar6 * 1.442695,(IVec3 *)c->textures);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar3 = (p->scale).m_data[3];
  fVar6 = (p->bias).m_data[1];
  fVar7 = (p->bias).m_data[2];
  fVar9 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * fStack_24 + fVar6;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar7;
  (c->color).m_data[3] = fVar3 * fStack_1c + fVar9;
  return;
}

Assistant:

static void		evalTexture2DProjGrad3Offset	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), computeLodFromGrad2D(c), p.offset.swizzle(0,1))*p.scale + p.bias; }